

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

void Hc3Zip_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  CLzRef CVar1;
  Byte *pBVar2;
  ushort uVar3;
  UInt32 UVar4;
  
  do {
    if (p->lenLimit < 3) {
      MatchFinder_MovePos(p);
    }
    else {
      pBVar2 = p->buffer;
      uVar3 = (ushort)p->crc[pBVar2[1]] ^ CONCAT11(*pBVar2,pBVar2[2]);
      CVar1 = p->hash[uVar3];
      p->hash[uVar3] = p->pos;
      p->son[p->cyclicBufferPos] = CVar1;
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = pBVar2 + 1;
      UVar4 = p->pos + 1;
      p->pos = UVar4;
      if (UVar4 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

void Hc3Zip_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    SKIP_HEADER(3)
    HASH_ZIP_CALC;
    curMatch = p->hash[hv];
    p->hash[hv] = p->pos;
    p->son[p->cyclicBufferPos] = curMatch;
    MOVE_POS
  }
  while (--num != 0);
}